

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

size_t __thiscall
booster::locale::impl_icu::number_format<wchar_t>::do_parse<double>
          (number_format<wchar_t> *this,string_type *str,double *v)

{
  undefined1 uVar1;
  int32_t iVar2;
  char_type_conflict *pcVar3;
  UnicodeString *str_00;
  char_type_conflict *pcVar4;
  long lVar5;
  undefined8 *in_RDX;
  long in_RDI;
  size_t cut;
  double tmp_v;
  UnicodeString tmp;
  ParsePosition pp;
  Formattable val;
  Formattable *in_stack_fffffffffffffe98;
  ParsePosition *in_stack_fffffffffffffea0;
  number_format<wchar_t> *in_stack_fffffffffffffea8;
  char_type_conflict *in_stack_fffffffffffffeb8;
  char_type_conflict *in_stack_fffffffffffffec0;
  icu_std_converter<wchar_t,_4> *this_00;
  icu_std_converter<wchar_t,_4> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined8 local_f8;
  UnicodeString local_f0 [80];
  ParsePosition local_a0 [16];
  Formattable local_90 [112];
  undefined8 *local_20;
  size_t local_8;
  
  local_20 = in_RDX;
  icu_70::Formattable::Formattable(local_90);
  icu_70::ParsePosition::ParsePosition(in_stack_fffffffffffffea0);
  std::__cxx11::wstring::data();
  std::__cxx11::wstring::data();
  std::__cxx11::wstring::size();
  icu_std_converter<wchar_t,_4>::icu
            (in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  (**(code **)(**(long **)(in_RDI + 0x10) + 0xa0))
            (*(long **)(in_RDI + 0x10),local_f0,local_90,local_a0);
  iVar2 = icu_70::ParsePosition::getIndex(local_a0);
  if ((iVar2 == 0) ||
     (uVar1 = get_value(in_stack_fffffffffffffea8,(double *)in_stack_fffffffffffffea0,
                        in_stack_fffffffffffffe98), !(bool)uVar1)) {
    local_8 = 0;
  }
  else {
    pcVar3 = (char_type_conflict *)(in_RDI + 8);
    str_00 = (UnicodeString *)std::__cxx11::wstring::data();
    pcVar4 = (char_type_conflict *)std::__cxx11::wstring::data();
    lVar5 = std::__cxx11::wstring::size();
    this_00 = (icu_std_converter<wchar_t,_4> *)(pcVar4 + lVar5);
    icu_70::ParsePosition::getIndex(local_a0);
    local_8 = icu_std_converter<wchar_t,_4>::cut
                        (this_00,str_00,pcVar3,pcVar4,(size_t)in_stack_fffffffffffffea0,0,
                         CONCAT17(uVar1,in_stack_fffffffffffffed0));
    if (local_8 == 0) {
      local_8 = 0;
    }
    else {
      *local_20 = local_f8;
    }
  }
  icu_70::UnicodeString::~UnicodeString(local_f0);
  icu_70::ParsePosition::~ParsePosition(local_a0);
  icu_70::Formattable::~Formattable(local_90);
  return local_8;
}

Assistant:

size_t do_parse(string_type const &str,ValueType &v) const
            {
                icu::Formattable val;
                icu::ParsePosition pp;
                icu::UnicodeString tmp = cvt_.icu(str.data(),str.data()+str.size());

                icu_fmt_->parse(tmp,val,pp);

                ValueType tmp_v;

                if(pp.getIndex() == 0 || !get_value(tmp_v,val))
                    return 0;
                size_t cut = cvt_.cut(tmp,str.data(),str.data()+str.size(),pp.getIndex());
                if(cut==0)
                    return 0;
                v=tmp_v;
                return cut;
            }